

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stl.h
# Opt level: O3

handle pybind11::detail::
       list_caster<std::vector<std::pair<unsigned_int,unsigned_int>,std::allocator<std::pair<unsigned_int,unsigned_int>>>,std::pair<unsigned_int,unsigned_int>>
       ::
       cast<std::vector<std::pair<unsigned_int,unsigned_int>,std::allocator<std::pair<unsigned_int,unsigned_int>>>&>
                 (vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
                  *src,return_value_policy policy,handle parent)

{
  pointer ppVar1;
  pointer ppVar2;
  PyObject *tmp;
  handle hVar3;
  pointer ppVar4;
  long lVar5;
  list l;
  object value_;
  handle local_40;
  object local_38;
  
  list::list((list *)&local_40,
             (long)(src->
                   super__Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
                   )._M_impl.super__Vector_impl_data._M_finish -
             (long)(src->
                   super__Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
                   )._M_impl.super__Vector_impl_data._M_start >> 3);
  ppVar1 = (src->
           super__Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  ppVar2 = (src->
           super__Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  if (ppVar1 != ppVar2) {
    lVar5 = 0;
    do {
      hVar3 = tuple_caster<std::pair,unsigned_int,unsigned_int>::
              cast_impl<std::pair<unsigned_int,unsigned_int>&,0ul,1ul>
                        ((long)&ppVar1->first + lVar5,policy,parent.m_ptr);
      if (hVar3.m_ptr == (PyObject *)0x0) {
        local_38.super_handle = hVar3;
        object::~object(&local_38);
        hVar3.m_ptr = (PyObject *)0x0;
        goto LAB_0017ed04;
      }
      local_38.super_handle.m_ptr = (handle)(PyObject *)0x0;
      *(PyObject **)((long)&((local_40.m_ptr[1].ob_type)->ob_base).ob_base.ob_refcnt + lVar5) =
           hVar3.m_ptr;
      object::~object(&local_38);
      ppVar4 = (pointer)((long)&ppVar1[1].first + lVar5);
      lVar5 = lVar5 + 8;
    } while (ppVar4 != ppVar2);
  }
  hVar3.m_ptr = local_40.m_ptr;
  local_40.m_ptr = (PyObject *)0x0;
LAB_0017ed04:
  object::~object((object *)&local_40);
  return (handle)hVar3.m_ptr;
}

Assistant:

static handle cast(T &&src, return_value_policy policy, handle parent) {
        if (!std::is_lvalue_reference<T>::value)
            policy = return_value_policy_override<Value>::policy(policy);
        list l(src.size());
        size_t index = 0;
        for (auto &&value : src) {
            auto value_ = reinterpret_steal<object>(value_conv::cast(forward_like<T>(value), policy, parent));
            if (!value_)
                return handle();
            PyList_SET_ITEM(l.ptr(), (ssize_t) index++, value_.release().ptr()); // steals a reference
        }
        return l.release();
    }